

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::LocalInvocationIDCase::LocalInvocationIDCase
          (LocalInvocationIDCase *this,Context *context)

{
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  *this_00;
  uint uVar1;
  UVec3 local_58;
  UVec3 local_4c;
  SubCase local_40;
  
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (&this->super_ComputeBuiltinVarCase,context,"local_invocation_id","gl_LocalInvocationID"
             ,TYPE_UINT_VEC3);
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_01e5a7d8;
  local_4c.m_data._0_8_ = &DAT_100000001;
  uVar1 = 1;
  local_58.m_data._0_8_ = &DAT_100000001;
  local_58.m_data[2] = uVar1;
  local_4c.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  this_00 = &(this->super_ComputeBuiltinVarCase).m_subCases;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data._0_8_ = &DAT_100000001;
  local_4c.m_data[2] = 1;
  local_58.m_data[0] = 2;
  local_58.m_data[1] = 7;
  local_58.m_data[2] = 3;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 1;
  local_58.m_data._0_8_ = &DAT_100000001;
  local_58.m_data[2] = uVar1;
  local_4c.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 3;
  local_58.m_data[2] = 5;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 3;
  local_58.m_data._0_8_ = &DAT_100000001;
  local_58.m_data[2] = uVar1;
  local_4c.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data._0_8_ = &DAT_100000001;
  local_4c.m_data[2] = 7;
  local_58.m_data._0_8_ = &DAT_100000001;
  local_58.m_data[2] = 1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data._0_8_ = &DAT_100000001;
  local_4c.m_data[2] = 7;
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 3;
  local_58.m_data[2] = 1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data[0] = 10;
  local_4c.m_data[1] = 3;
  local_4c.m_data[2] = 4;
  local_58.m_data._0_8_ = &DAT_100000001;
  local_58.m_data[2] = 1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  local_4c.m_data[0] = 10;
  local_4c.m_data[1] = 3;
  local_4c.m_data[2] = 4;
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 1;
  local_58.m_data[2] = 2;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_40,&local_4c,&local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_40);
  return;
}

Assistant:

LocalInvocationIDCase (Context& context)
		: ComputeBuiltinVarCase(context, "local_invocation_id", "gl_LocalInvocationID", TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(2,7,3)));
		m_subCases.push_back(SubCase(UVec3(2,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(2,1,1), UVec3(1,3,5)));
		m_subCases.push_back(SubCase(UVec3(1,3,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,7), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,7), UVec3(3,3,1)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(3,1,2)));
	}